

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

void P_Recalculate3DFloors(sector_t_conflict *sector)

{
  sector_t *psVar1;
  short *psVar2;
  F3DFloor *pFVar3;
  uint uVar4;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 aVar5;
  TArray<F3DFloor_*,_F3DFloor_*> *this;
  F3DFloor **ppFVar6;
  lightlist_t *plVar7;
  FDynamicColormap *pFVar8;
  F3DFloor *pFVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double ff_bottom_1;
  double ff_bottom;
  double ff_top;
  F3DFloor *dyn_2;
  F3DFloor *dyn_1;
  F3DFloor *dyn;
  double pick_bottom;
  double h2;
  double height;
  F3DFloor *rover_1;
  undefined1 local_128 [8];
  TArray<F3DFloor_*,_F3DFloor_*> oldlist;
  TArray<lightlist_t,_lightlist_t> *lightlist;
  TArray<F3DFloor_*,_F3DFloor_*> *ffloors;
  lightlist_t resetlight;
  lightlist_t newlight;
  uint j;
  uint i;
  double minheight;
  double maxheight;
  double clipped_bottom;
  double clipped_top;
  double solid_bottom;
  F3DFloor *solid;
  F3DFloor *clipped;
  F3DFloor *pFStack_20;
  uint pickindex;
  F3DFloor *pick;
  F3DFloor *rover;
  sector_t_conflict *sector_local;
  
  solid = (F3DFloor *)0x0;
  solid_bottom = 0.0;
  clipped_top = 0.0;
  maxheight = 0.0;
  rover = (F3DFloor *)sector;
  lightlist_t::lightlist_t((lightlist_t *)&resetlight.caster);
  lightlist_t::lightlist_t((lightlist_t *)&ffloors);
  this = (TArray<F3DFloor_*,_F3DFloor_*> *)(*(long *)&rover[3].top.copied + 0x70);
  oldlist._8_8_ = *(long *)&rover[3].top.copied + 0x80;
  uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size(this);
  if (1 < uVar4) {
    TArray<F3DFloor_*,_F3DFloor_*>::TArray((TArray<F3DFloor_*,_F3DFloor_*> *)local_128);
    TArray<F3DFloor_*,_F3DFloor_*>::operator=((TArray<F3DFloor_*,_F3DFloor_*> *)local_128,this);
    TArray<F3DFloor_*,_F3DFloor_*>::Clear(this);
    for (newlight.caster._4_4_ = 0;
        uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size((TArray<F3DFloor_*,_F3DFloor_*> *)local_128),
        newlight.caster._4_4_ < uVar4; newlight.caster._4_4_ = newlight.caster._4_4_ + 1) {
      ppFVar6 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)local_128,(ulong)newlight.caster._4_4_)
      ;
      height = (double)*ppFVar6;
      if ((((F3DFloor *)height)->flags & 0x800000) == 0) {
        if ((((F3DFloor *)height)->flags & 0x1000000) != 0) {
          ((F3DFloor *)height)->flags = ((F3DFloor *)height)->flags & 0xfeffffff;
          ((F3DFloor *)height)->flags = ((F3DFloor *)height)->flags | 1;
        }
      }
      else {
        if ((F3DFloor *)height != (F3DFloor *)0x0) {
          operator_delete((void *)height,0x98);
        }
        TArray<F3DFloor_*,_F3DFloor_*>::Delete
                  ((TArray<F3DFloor_*,_F3DFloor_*> *)local_128,newlight.caster._4_4_);
        newlight.caster._4_4_ = newlight.caster._4_4_ - 1;
      }
    }
    while (uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size((TArray<F3DFloor_*,_F3DFloor_*> *)local_128)
          , uVar4 != 0) {
      ppFVar6 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)local_128,0);
      pFStack_20 = *ppFVar6;
      h2 = secplane_t::ZatPoint((pFStack_20->top).plane,(DVector2 *)&rover[1].ceilingclip);
      clipped._4_4_ = 0;
      for (newlight.caster._0_4_ = 1;
          uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size((TArray<F3DFloor_*,_F3DFloor_*> *)local_128),
          (uint)newlight.caster < uVar4; newlight.caster._0_4_ = (uint)newlight.caster + 1) {
        ppFVar6 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                            ((TArray<F3DFloor_*,_F3DFloor_*> *)local_128,
                             (ulong)(uint)newlight.caster);
        pick_bottom = secplane_t::ZatPoint
                                (((*ppFVar6)->top).plane,(DVector2 *)&rover[1].ceilingclip);
        if (h2 < pick_bottom) {
          ppFVar6 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)local_128,
                               (ulong)(uint)newlight.caster);
          pFStack_20 = *ppFVar6;
          clipped._4_4_ = (uint)newlight.caster;
          h2 = pick_bottom;
        }
      }
      TArray<F3DFloor_*,_F3DFloor_*>::Delete
                ((TArray<F3DFloor_*,_F3DFloor_*> *)local_128,clipped._4_4_);
      pFVar9 = (F3DFloor *)
               secplane_t::ZatPoint((pFStack_20->bottom).plane,(DVector2 *)&rover[1].ceilingclip);
      dyn = pFVar9;
      if ((pFStack_20->flags & 0x40000000) == 0) {
        if ((((pFStack_20->flags & 0x810) == 0) && ((pFStack_20->flags & 0xc) != 0)) ||
           ((pFStack_20->flags & 1) == 0)) {
          if ((solid == (F3DFloor *)0x0) || (h2 <= maxheight)) {
            solid = (F3DFloor *)0x0;
            if ((solid_bottom == 0.0) || ((double)pFVar9 < clipped_top)) {
              solid_bottom = (double)pFStack_20;
              clipped_top = (double)pFVar9;
            }
            TArray<F3DFloor_*,_F3DFloor_*>::Push(this,&stack0xffffffffffffffe0);
          }
          else {
            ff_top = (double)operator_new(0x98);
            memcpy((void *)ff_top,solid,0x98);
            solid->flags = solid->flags | 0x1000000;
            solid->flags = solid->flags & 0xfffffffe;
            *(uint *)((long)ff_top + 0x58) = *(uint *)((long)ff_top + 0x58) | 0x800000;
            F3DFloor::planeref::copyPlane((planeref *)ff_top,&pFStack_20->top);
            TArray<F3DFloor_*,_F3DFloor_*>::Push(this,(F3DFloor **)&ff_top);
            TArray<F3DFloor_*,_F3DFloor_*>::Push(this,&stack0xffffffffffffffe0);
            if (maxheight < (double)dyn) {
              ff_top = (double)operator_new(0x98);
              memcpy((void *)ff_top,solid,0x98);
              *(uint *)((long)ff_top + 0x58) = *(uint *)((long)ff_top + 0x58) | 0x800001;
              F3DFloor::planeref::copyPlane((planeref *)((long)ff_top + 0x28),&pFStack_20->bottom);
              TArray<F3DFloor_*,_F3DFloor_*>::Push(this,(F3DFloor **)&ff_top);
              solid = (F3DFloor *)ff_top;
            }
            else {
              solid = (F3DFloor *)0x0;
            }
            solid_bottom = (double)pFStack_20;
            clipped_top = (double)dyn;
          }
        }
        else if ((solid_bottom == 0.0) || (h2 <= clipped_top)) {
          if ((double)pFVar9 <= h2) {
            solid = pFStack_20;
            TArray<F3DFloor_*,_F3DFloor_*>::Push(this,&stack0xffffffffffffffe0);
            maxheight = (double)pFVar9;
          }
          else {
            dyn_2 = (F3DFloor *)operator_new(0x98);
            memcpy(dyn_2,pFStack_20,0x98);
            pFStack_20->flags = pFStack_20->flags | 0x1000000;
            pFStack_20->flags = pFStack_20->flags & 0xfffffffe;
            dyn_2->flags = dyn_2->flags | 0x800000;
            F3DFloor::planeref::copyPlane(&dyn_2->bottom,&pFStack_20->top);
            TArray<F3DFloor_*,_F3DFloor_*>::Push(this,&stack0xffffffffffffffe0);
            TArray<F3DFloor_*,_F3DFloor_*>::Push(this,&dyn_2);
          }
        }
        else {
          TArray<F3DFloor_*,_F3DFloor_*>::Push(this,&stack0xffffffffffffffe0);
          if ((double)dyn <= clipped_top) {
            dyn_1 = (F3DFloor *)operator_new(0x98);
            memcpy(dyn_1,pFStack_20,0x98);
            pFStack_20->flags = pFStack_20->flags | 0x1000000;
            pFStack_20->flags = pFStack_20->flags & 0xfffffffe;
            dyn_1->flags = dyn_1->flags | 0x800000;
            F3DFloor::planeref::copyPlane(&dyn_1->top,(planeref *)solid_bottom);
            TArray<F3DFloor_*,_F3DFloor_*>::Push(this,&dyn_1);
            solid = dyn_1;
            maxheight = (double)dyn;
          }
          else {
            pFStack_20->flags = pFStack_20->flags | 0x1000000;
            pFStack_20->flags = pFStack_20->flags & 0xfffffffe;
          }
        }
      }
      else {
        TArray<F3DFloor_*,_F3DFloor_*>::Push(this,&stack0xffffffffffffffe0);
      }
    }
    TArray<F3DFloor_*,_F3DFloor_*>::~TArray((TArray<F3DFloor_*,_F3DFloor_*> *)local_128);
  }
  uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size(this);
  if (uVar4 != 0) {
    TArray<lightlist_t,_lightlist_t>::Resize((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,1);
    pFVar9 = rover + 1;
    plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                       ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
    secplane_t::operator=(&plVar7->plane,(secplane_t *)&(pFVar9->top).isceiling);
    pFVar9 = rover + 1;
    plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                       ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
    plVar7->p_lightlevel = (short *)((long)&pFVar9->lastlight + 2);
    plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                       ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
    plVar7->caster = (F3DFloor *)0x0;
    plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                       ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
    plVar7->lightsource = (F3DFloor *)0x0;
    psVar1 = rover[1].model;
    plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                       ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
    plVar7->extra_colormap = (FDynamicColormap *)psVar1;
    plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                       ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
    PalEntry::operator=(&plVar7->blend,0);
    plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                       ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
    plVar7->flags = 0;
    plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                       ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
    lightlist_t::operator=((lightlist_t *)&ffloors,plVar7);
    dVar10 = secplane_t::ZatPoint
                       ((secplane_t *)&rover[1].top.isceiling,(DVector2 *)&rover[1].ceilingclip);
    dVar11 = secplane_t::ZatPoint
                       ((secplane_t *)&rover[1].bottom.isceiling,(DVector2 *)&rover[1].ceilingclip);
    for (newlight.caster._4_4_ = 0; uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size(this),
        newlight.caster._4_4_ < uVar4; newlight.caster._4_4_ = newlight.caster._4_4_ + 1) {
      ppFVar6 = TArray<F3DFloor_*,_F3DFloor_*>::operator[](this,(ulong)newlight.caster._4_4_);
      pick = *ppFVar6;
      if (((pick->flags & 1) != 0) && ((pick->flags & 0x20) == 0)) {
        dVar12 = secplane_t::ZatPoint((pick->top).plane,(DVector2 *)&rover[1].ceilingclip);
        if (dVar12 < dVar11) {
          return;
        }
        if (dVar10 <= dVar12) {
          dVar12 = secplane_t::ZatPoint((pick->bottom).plane,(DVector2 *)&rover[1].ceilingclip);
          if (dVar12 < dVar10) {
            psVar2 = pick->toplightlevel;
            plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                               ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
            pFVar9 = pick;
            plVar7->p_lightlevel = psVar2;
            plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                               ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
            pFVar3 = pick;
            plVar7->caster = pFVar9;
            plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                               ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
            plVar7->lightsource = pFVar3;
            pFVar8 = F3DFloor::GetColormap(pick);
            plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                               ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
            plVar7->extra_colormap = pFVar8;
            aVar5 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
                    F3DFloor::GetBlend(pick);
            plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                               ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
            (plVar7->blend).field_0.field_0 = aVar5;
            uVar4 = pick->flags;
            plVar7 = TArray<lightlist_t,_lightlist_t>::operator[]
                               ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,0);
            plVar7->flags = uVar4;
          }
        }
        else {
          secplane_t::operator=((secplane_t *)&resetlight.caster,(pick->top).plane);
          F3DFloor::GetColormap(pick);
          F3DFloor::GetBlend(pick);
          TArray<lightlist_t,_lightlist_t>::Push
                    ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,
                     (lightlist_t *)&resetlight.caster);
        }
        if ((pick->flags & 0x80010000) == 0) {
          plVar7 = TArray<lightlist_t,_lightlist_t>::Last
                             ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_);
          lightlist_t::operator=((lightlist_t *)&ffloors,plVar7);
        }
        else if ((pick->flags & 0x80000000) != 0) {
          resetlight.plane.negiC = (double)((long)&rover[1].lastlight + 2);
          resetlight.blend.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
          resetlight.flags = 0;
          resetlight.p_lightlevel = (short *)rover[1].model;
          PalEntry::operator=((PalEntry *)&resetlight.extra_colormap,0);
        }
        if ((((pick->flags & 0x10000) != 0) &&
            (dVar12 = secplane_t::ZatPoint((pick->bottom).plane,(DVector2 *)&rover[1].ceilingclip),
            dVar12 < dVar10)) && (dVar11 < dVar12)) {
          secplane_t::operator=((secplane_t *)&resetlight.caster,(pick->bottom).plane);
          TArray<lightlist_t,_lightlist_t>::Push
                    ((TArray<lightlist_t,_lightlist_t> *)oldlist._8_8_,
                     (lightlist_t *)&resetlight.caster);
        }
      }
    }
  }
  return;
}

Assistant:

void P_Recalculate3DFloors(sector_t * sector)
{
	F3DFloor *		rover;
	F3DFloor *		pick;
	unsigned		pickindex;
	F3DFloor *		clipped=NULL;
	F3DFloor *		solid=NULL;
	double			solid_bottom=0;
	double			clipped_top;
	double			clipped_bottom=0;
	double			maxheight, minheight;
	unsigned		i, j;
	lightlist_t newlight;
	lightlist_t resetlight;	// what it goes back to after FF_DOUBLESHADOW

	TArray<F3DFloor*> & ffloors=sector->e->XFloor.ffloors;
	TArray<lightlist_t> & lightlist = sector->e->XFloor.lightlist;

	// Sort the floors top to bottom for quicker access here and later
	// Translucent and swimmable floors are split if they overlap with solid ones.
	if (ffloors.Size()>1)
	{
		TArray<F3DFloor*> oldlist;
		
		oldlist = ffloors;
		ffloors.Clear();

		// first delete the old dynamic stuff
		for(i=0;i<oldlist.Size();i++)
		{
			F3DFloor * rover=oldlist[i];

			if (rover->flags&FF_DYNAMIC)
			{
				delete rover;
				oldlist.Delete(i);
				i--;
				continue;
			}
			if (rover->flags&FF_CLIPPED)
			{
				rover->flags&=~FF_CLIPPED;
				rover->flags|=FF_EXISTS;
			}
		}

		while (oldlist.Size())
		{
			pick=oldlist[0];
			double height=pick->top.plane->ZatPoint(sector->centerspot);

			// find highest starting ffloor - intersections are not supported!
			pickindex=0;
			for (j=1;j<oldlist.Size();j++)
			{
				double h2=oldlist[j]->top.plane->ZatPoint(sector->centerspot);

				if (h2>height)
				{
					pick=oldlist[j];
					pickindex=j;
					height=h2;
				}
			}

			oldlist.Delete(pickindex);
			double pick_bottom=pick->bottom.plane->ZatPoint(sector->centerspot);

			if (pick->flags & FF_THISINSIDE)
			{
				// These have the floor higher than the ceiling and cannot be processed
				// by the clipping code below.
				ffloors.Push(pick);
			}
			else if ((pick->flags&(FF_SWIMMABLE|FF_TRANSLUCENT) || (!(pick->flags&FF_RENDERALL))) && pick->flags&FF_EXISTS)
			{
				// We must check if this nonsolid segment gets clipped from the top by another 3D floor
				if (solid != NULL && solid_bottom < height)
				{
					ffloors.Push(pick);
					if (solid_bottom < pick_bottom)
					{
						// this one is fully covered
						pick->flags|=FF_CLIPPED;
						pick->flags&=~FF_EXISTS;
					}
					else
					{
						F3DFloor * dyn=new F3DFloor;
						*dyn=*pick;
						pick->flags|=FF_CLIPPED;
						pick->flags&=~FF_EXISTS;
						dyn->flags|=FF_DYNAMIC;
						dyn->top.copyPlane(&solid->bottom);
						ffloors.Push(dyn);

						clipped = dyn;
						clipped_top = solid_bottom;
						clipped_bottom = pick_bottom;
					}
				}
				else if (pick_bottom > height)	// do not allow inverted planes
				{
					F3DFloor * dyn = new F3DFloor;
					*dyn = *pick;
					pick->flags |= FF_CLIPPED;
					pick->flags &= ~FF_EXISTS;
					dyn->flags |= FF_DYNAMIC;
					dyn->bottom.copyPlane(&pick->top);
					ffloors.Push(pick);
					ffloors.Push(dyn);
				}
				else
				{
					clipped = pick;
					clipped_top = height;
					clipped_bottom = pick_bottom;
					ffloors.Push(pick);
				}
			}
			else if (clipped && clipped_bottom<height)
			{
				// translucent floor above must be clipped to this one!
				F3DFloor * dyn=new F3DFloor;
				*dyn=*clipped;
				clipped->flags|=FF_CLIPPED;
				clipped->flags&=~FF_EXISTS;
				dyn->flags|=FF_DYNAMIC;
				dyn->bottom.copyPlane(&pick->top);
				ffloors.Push(dyn);
				ffloors.Push(pick);

				if (pick_bottom<=clipped_bottom)
				{
					clipped=NULL;
				}
				else
				{
					// the translucent part extends below the clipper
					dyn=new F3DFloor;
					*dyn=*clipped;
					dyn->flags|=FF_DYNAMIC|FF_EXISTS;
					dyn->top.copyPlane(&pick->bottom);
					ffloors.Push(dyn);
					clipped = dyn;
					clipped_top = pick_bottom;
				}
				solid = pick;
				solid_bottom = pick_bottom;
			}
			else
			{
				clipped = NULL;
				if (solid == NULL || solid_bottom > pick_bottom)
				{
					// only if this one is lower
					solid = pick;
					solid_bottom = pick_bottom;
				}
				ffloors.Push(pick);

			}

		}
	}

	// having the floors sorted makes this routine significantly simpler
	// Only some overlapping cases with FF_DOUBLESHADOW might create anomalies
	// but these are clearly undefined.
	if(ffloors.Size())
	{
		lightlist.Resize(1);
		lightlist[0].plane = sector->ceilingplane;
		lightlist[0].p_lightlevel = &sector->lightlevel;
		lightlist[0].caster = NULL;
		lightlist[0].lightsource = NULL;
		lightlist[0].extra_colormap = sector->ColorMap;
		lightlist[0].blend = 0;
		lightlist[0].flags = 0;

		resetlight = lightlist[0];

		maxheight = sector->ceilingplane.ZatPoint(sector->centerspot);
		minheight = sector->floorplane.ZatPoint(sector->centerspot);
		for(i = 0; i < ffloors.Size(); i++)
		{
			rover=ffloors[i];

			if ( !(rover->flags & FF_EXISTS) || rover->flags & FF_NOSHADE )
				continue;
				
			double ff_top=rover->top.plane->ZatPoint(sector->centerspot);
			if (ff_top < minheight) break;	// reached the floor
			if (ff_top < maxheight)
			{
				newlight.plane = *rover->top.plane;
				newlight.p_lightlevel = rover->toplightlevel;
				newlight.caster = rover;
				newlight.lightsource = rover;
				newlight.extra_colormap = rover->GetColormap();
				newlight.blend = rover->GetBlend();
				newlight.flags = rover->flags;
				lightlist.Push(newlight);
			}
			else
			{
				double ff_bottom=rover->bottom.plane->ZatPoint(sector->centerspot);
				if (ff_bottom<maxheight)
				{
					// this segment begins over the ceiling and extends beyond it
					lightlist[0].p_lightlevel = rover->toplightlevel;
					lightlist[0].caster = rover;
					lightlist[0].lightsource = rover;
					lightlist[0].extra_colormap = rover->GetColormap();
					lightlist[0].blend = rover->GetBlend();
					lightlist[0].flags = rover->flags;
				}
			}
			if (!(rover->flags & (FF_DOUBLESHADOW | FF_RESET)))
			{
				resetlight = lightlist.Last();
			}
			else if (rover->flags & FF_RESET)
			{
				resetlight.p_lightlevel = &sector->lightlevel;
				resetlight.lightsource = NULL;
				resetlight.extra_colormap = sector->ColorMap;
				resetlight.blend = 0;
			}

			if (rover->flags&FF_DOUBLESHADOW)
			{
				double ff_bottom=rover->bottom.plane->ZatPoint(sector->centerspot);
				if(ff_bottom < maxheight && ff_bottom>minheight)
				{
					newlight.caster = rover;
					newlight.plane = *rover->bottom.plane;
					newlight.lightsource = resetlight.lightsource;
					newlight.p_lightlevel = resetlight.p_lightlevel;
					newlight.extra_colormap = resetlight.extra_colormap;
					newlight.blend = resetlight.blend;
					newlight.flags = rover->flags;
					lightlist.Push(newlight);
				}
			}
		}
	}
}